

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Human.cpp
# Opt level: O2

string * __thiscall Human::Name_Getter_abi_cxx11_(string *__return_storage_ptr__,Human *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Name);
  return __return_storage_ptr__;
}

Assistant:

string Human ::Name_Getter(){
    return Name;
}